

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tasn_fre.cc
# Opt level: O0

void ASN1_primitive_free(ASN1_VALUE **pval,ASN1_ITEM *it)

{
  undefined4 local_20;
  int utype;
  ASN1_ITEM *it_local;
  ASN1_VALUE **pval_local;
  
  if (it->tcount != 0) {
    __assert_fail("it->funcs == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/tasn_fre.cc"
                  ,0x84,"void ASN1_primitive_free(ASN1_VALUE **, const ASN1_ITEM *)");
  }
  if (it->itype == '\x05') {
    local_20 = 0xffffffff;
  }
  else {
    local_20 = *(undefined4 *)&it->field_0x4;
  }
  switch(local_20) {
  case 1:
    if (it != (ASN1_ITEM *)0x0) {
      *(int *)pval = (int)it->funcs;
      return;
    }
    *(undefined4 *)pval = 0xffffffff;
    return;
  case 5:
    break;
  case 6:
    ASN1_OBJECT_free((ASN1_OBJECT *)*pval);
    break;
  case 0xfffffffc:
    if (*pval != (ASN1_VALUE *)0x0) {
      asn1_type_cleanup((ASN1_TYPE *)*pval);
      OPENSSL_free(*pval);
    }
    break;
  default:
    ASN1_STRING_free((ASN1_STRING *)*pval);
    *pval = (ASN1_VALUE *)0x0;
  }
  *pval = (ASN1_VALUE *)0x0;
  return;
}

Assistant:

void ASN1_primitive_free(ASN1_VALUE **pval, const ASN1_ITEM *it) {
  // Historically, |it->funcs| for primitive types contained an
  // |ASN1_PRIMITIVE_FUNCS| table of calbacks.
  assert(it->funcs == NULL);

  int utype = it->itype == ASN1_ITYPE_MSTRING ? -1 : it->utype;
  switch (utype) {
    case V_ASN1_OBJECT:
      ASN1_OBJECT_free((ASN1_OBJECT *)*pval);
      break;

    case V_ASN1_BOOLEAN:
      if (it) {
        *(ASN1_BOOLEAN *)pval = (ASN1_BOOLEAN)it->size;
      } else {
        *(ASN1_BOOLEAN *)pval = ASN1_BOOLEAN_NONE;
      }
      return;

    case V_ASN1_NULL:
      break;

    case V_ASN1_ANY:
      if (*pval != NULL) {
        asn1_type_cleanup((ASN1_TYPE *)*pval);
        OPENSSL_free(*pval);
      }
      break;

    default:
      ASN1_STRING_free((ASN1_STRING *)*pval);
      *pval = NULL;
      break;
  }
  *pval = NULL;
}